

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  LogMessage local_1b0;
  char *pcVar5;
  
  pcVar4 = rewrite->data_;
  pcVar3 = pcVar4 + rewrite->size_;
  do {
    if (pcVar3 <= pcVar4) {
LAB_001a8acc:
      return pcVar3 <= pcVar4;
    }
    if (*pcVar4 != '\\') {
      std::__cxx11::string::push_back((char)out);
      pcVar5 = pcVar4;
      goto LAB_001a8a19;
    }
    pcVar5 = pcVar4 + 1;
    if (pcVar3 <= pcVar5) {
LAB_001a8a1e:
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x3af);
        poVar2 = std::operator<<((ostream *)&local_1b0.str_,"invalid rewrite pattern: ");
        std::operator<<(poVar2,rewrite->data_);
LAB_001a8ac2:
        LogMessage::~LogMessage(&local_1b0);
      }
      goto LAB_001a8acc;
    }
    uVar1 = (int)*pcVar5 - 0x30;
    if (uVar1 < 10) {
      if (veclen <= (int)uVar1) {
        if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x3a3);
          poVar2 = std::operator<<((ostream *)&local_1b0.str_,"requested group ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
          poVar2 = std::operator<<(poVar2," in regexp ");
          std::operator<<(poVar2,rewrite->data_);
          goto LAB_001a8ac2;
        }
        goto LAB_001a8acc;
      }
      if (vec[uVar1].size_ != 0) {
        std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].data_);
      }
    }
    else {
      if (*pcVar5 != '\\') goto LAB_001a8a1e;
      std::__cxx11::string::push_back((char)out);
    }
LAB_001a8a19:
    pcVar4 = pcVar5 + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}